

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O3

void __thiscall cmOrderDirectories::~cmOrderDirectories(cmOrderDirectories *this)

{
  pointer ppcVar1;
  pointer piVar2;
  char *pcVar3;
  pointer pcVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  pointer ppcVar6;
  
  ppcVar1 = (this->ConstraintEntries).
            super__Vector_base<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppcVar6 = (this->ConstraintEntries).
                 super__Vector_base<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppcVar6 != ppcVar1;
      ppcVar6 = ppcVar6 + 1) {
    if (*ppcVar6 != (cmOrderDirectoriesConstraint *)0x0) {
      (*(*ppcVar6)->_vptr_cmOrderDirectoriesConstraint[1])();
    }
  }
  ppcVar1 = (this->ImplicitDirEntries).
            super__Vector_base<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppcVar6 = (this->ImplicitDirEntries).
                 super__Vector_base<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppcVar6 != ppcVar1;
      ppcVar6 = ppcVar6 + 1) {
    if (*ppcVar6 != (cmOrderDirectoriesConstraint *)0x0) {
      (*(*ppcVar6)->_vptr_cmOrderDirectoriesConstraint[1])();
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->RealPaths)._M_t);
  std::vector<cmOrderDirectories::ConflictList,_std::allocator<cmOrderDirectories::ConflictList>_>::
  ~vector(&this->ConflictGraph);
  piVar2 = (this->DirectoryVisited).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2,(long)(this->DirectoryVisited).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar2);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&(this->DirectoryIndex)._M_t);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->OriginalDirectories);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->EmmittedConstraintLibrary)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->EmmittedConstraintSOName)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->ImplicitDirectories)._M_t);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->LinkExtensions);
  pcVar3 = (this->RemoveLibraryExtension).program;
  if (pcVar3 != (char *)0x0) {
    operator_delete__(pcVar3);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->LanguageDirectories);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->UserDirectories);
  ppcVar6 = (this->ImplicitDirEntries).
            super__Vector_base<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppcVar6 != (pointer)0x0) {
    operator_delete(ppcVar6,(long)(this->ImplicitDirEntries).
                                  super__Vector_base<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppcVar6
                   );
  }
  ppcVar6 = (this->ConstraintEntries).
            super__Vector_base<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppcVar6 != (pointer)0x0) {
    operator_delete(ppcVar6,(long)(this->ConstraintEntries).
                                  super__Vector_base<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppcVar6
                   );
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->OrderedDirectories);
  pcVar4 = (this->Purpose)._M_dataplus._M_p;
  paVar5 = &(this->Purpose).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar5) {
    operator_delete(pcVar4,paVar5->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

cmOrderDirectories::~cmOrderDirectories()
{
  cmDeleteAll(this->ConstraintEntries);
  cmDeleteAll(this->ImplicitDirEntries);
}